

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor.cpp
# Opt level: O2

void __thiscall
FIX::SocketMonitor::processExceptSet(SocketMonitor *this,Strategy *strategy,fd_set *exceptSet)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  Sockets sockets;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&sockets._M_t,&(this->m_connectSockets)._M_t);
  for (p_Var2 = sockets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &sockets._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = p_Var2[1]._M_color;
    if (((ulong)exceptSet->fds_bits[(int)_Var1 / 0x40] >> ((long)(int)_Var1 % 0x40 & 0x3fU) & 1) !=
        0) {
      (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)_Var1);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&sockets._M_t);
  return;
}

Assistant:

void SocketMonitor::processExceptSet( Strategy& strategy, fd_set& exceptSet )
{
#ifdef _MSC_VER
  for ( unsigned i = 0; i < exceptSet.fd_count; ++i )
  {
    int s = exceptSet.fd_array[ i ];
    strategy.onError( *this, s );
  }
#else
    Sockets::iterator i;
    Sockets sockets = m_connectSockets;
    for ( i = sockets.begin(); i != sockets.end(); ++i )
    {
      int s = *i;
      if ( !FD_ISSET( *i, &exceptSet ) )
        continue;
      strategy.onError( *this, s );
    }
#endif
}